

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_0>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_0> *this)

{
  long *plVar1;
  long in_RDI;
  C_A_T_C_H_T_E_S_T_0 obj;
  code *local_50;
  long local_20 [4];
  
  anon_unknown.dwarf_ec393::C_A_T_C_H_T_E_S_T_0::C_A_T_C_H_T_E_S_T_0
            ((C_A_T_C_H_T_E_S_T_0 *)0x15f34d);
  local_50 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_20 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_50 & 1) != 0) {
    local_50 = *(code **)(local_50 + *plVar1 + -1);
  }
  (*local_50)(plVar1);
  anon_unknown.dwarf_ec393::C_A_T_C_H_T_E_S_T_0::~C_A_T_C_H_T_E_S_T_0
            ((C_A_T_C_H_T_E_S_T_0 *)0x15f3b4);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }